

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

void active_outbound_item_reset(nghttp2_active_outbound_item *aob,nghttp2_mem *mem)

{
  nghttp2_mem *mem_local;
  nghttp2_active_outbound_item *aob_local;
  
  nghttp2_outbound_item_free(aob->item,mem);
  nghttp2_mem_free(mem,aob->item);
  aob->item = (nghttp2_outbound_item *)0x0;
  nghttp2_bufs_reset(&aob->framebufs);
  aob->state = NGHTTP2_OB_POP_ITEM;
  return;
}

Assistant:

static void active_outbound_item_reset(nghttp2_active_outbound_item *aob,
                                       nghttp2_mem *mem) {
  DEBUGF("send: reset nghttp2_active_outbound_item\n");
  DEBUGF("send: aob->item = %p\n", aob->item);
  nghttp2_outbound_item_free(aob->item, mem);
  nghttp2_mem_free(mem, aob->item);
  aob->item = NULL;
  nghttp2_bufs_reset(&aob->framebufs);
  aob->state = NGHTTP2_OB_POP_ITEM;
}